

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_key_encode_decode.cpp
# Opt level: O0

void anon_unknown.dwarf_a3d2::do_pad_test_large_string
               (key_encoder *enc,size_t nbytes,bool expect_truncation)

{
  bool bVar1;
  char *pcVar2;
  allocator<char> *__a;
  string_view sv;
  AssertHelper local_a8;
  Message local_a0;
  size_type local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  unsigned_long max_key_size;
  key_view kv;
  size_t local_60;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string buf;
  bool expect_truncation_local;
  size_t nbytes_local;
  key_encoder *enc_local;
  
  __a = &local_41;
  buf.field_2._M_local_buf[0xf] = expect_truncation;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,nbytes,'a',__a);
  std::allocator<char>::~allocator(&local_41);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,'\0');
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40)
  ;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&kv._M_extent,pcVar2,nbytes);
  sv._M_str = (char *)__a;
  sv._M_len = local_60;
  do_simple_pad_test((anon_unknown_dwarf_a3d2 *)enc,(key_encoder *)kv._M_extent._M_extent_value,sv);
  if ((buf.field_2._M_local_buf[0xf] & 1U) != 0) {
    _max_key_size = unodb::key_encoder::get_key_view(enc);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0xffff;
    local_98 = std::span<const_std::byte,_18446744073709551615UL>::size
                         ((span<const_std::byte,_18446744073709551615UL> *)&max_key_size);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_90,"(kv.size())","(max_key_size)",&local_98,
               (unsigned_long *)&gtest_ar.message_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar1) {
      testing::Message::Message(&local_a0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
                 ,0x2d3,pcVar2);
      testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      testing::Message::~Message(&local_a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void do_pad_test_large_string(unodb::key_encoder& enc, size_t nbytes,
                              bool expect_truncation = false) {
  std::string buf(nbytes, 'a');
  buf.push_back('\0');
  do_simple_pad_test(enc, std::string_view(buf.data(), nbytes));
  if (expect_truncation) {
    const auto kv = enc.get_key_view();
    constexpr auto max_key_size = unodb::key_encoder::maxlen +
                                  sizeof(unodb::key_encoder::pad) +
                                  sizeof(unodb::key_encoder::size_type);
    UNODB_EXPECT_EQ(kv.size(), max_key_size);
  }
}